

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_paged_audio_buffer_data_append_page
                    (ma_paged_audio_buffer_data *pData,ma_paged_audio_buffer_page *pPage)

{
  long *plVar1;
  long in_RSI;
  long in_RDI;
  bool bVar2;
  ma_paged_audio_buffer_page *pNewTail;
  ma_paged_audio_buffer_page *pOldTail;
  ma_result local_74;
  
  if ((in_RDI == 0) || (in_RSI == 0)) {
    local_74 = MA_INVALID_ARGS;
  }
  else {
    do {
      plVar1 = *(long **)(in_RDI + 0x20);
      LOCK();
      bVar2 = plVar1 == *(long **)(in_RDI + 0x20);
      if (bVar2) {
        *(long *)(in_RDI + 0x20) = in_RSI;
      }
      UNLOCK();
    } while (!bVar2);
    LOCK();
    *plVar1 = in_RSI;
    UNLOCK();
    local_74 = MA_SUCCESS;
  }
  return local_74;
}

Assistant:

MA_API ma_result ma_paged_audio_buffer_data_append_page(ma_paged_audio_buffer_data* pData, ma_paged_audio_buffer_page* pPage)
{
    if (pData == NULL || pPage == NULL) {
        return MA_INVALID_ARGS;
    }

    /* This function assumes the page has been filled with audio data by this point. As soon as we append, the page will be available for reading. */

    /* First thing to do is update the tail. */
    for (;;) {
        ma_paged_audio_buffer_page* pOldTail = (ma_paged_audio_buffer_page*)ma_atomic_load_ptr(&pData->pTail);
        ma_paged_audio_buffer_page* pNewTail = pPage;

        if (ma_atomic_compare_exchange_weak_ptr((volatile void**)&pData->pTail, (void**)&pOldTail, pNewTail)) {
            /* Here is where we append the page to the list. After this, the page is attached to the list and ready to be read from. */
            ma_atomic_exchange_ptr(&pOldTail->pNext, pPage);
            break;  /* Done. */
        }
    }

    return MA_SUCCESS;
}